

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O0

void beltKeyExpand2(u32 *key_,octet *key,size_t len)

{
  void *in_RDX;
  u32 *in_RSI;
  uint *in_RDI;
  
  u32From(in_RSI,in_RDX,0x1482e5);
  if (in_RDX == (void *)0x10) {
    in_RDI[4] = *in_RDI;
    in_RDI[5] = in_RDI[1];
    in_RDI[6] = in_RDI[2];
    in_RDI[7] = in_RDI[3];
  }
  else if (in_RDX == (void *)0x18) {
    in_RDI[6] = *in_RDI ^ in_RDI[1] ^ in_RDI[2];
    in_RDI[7] = in_RDI[3] ^ in_RDI[4] ^ in_RDI[5];
  }
  return;
}

Assistant:

void beltKeyExpand2(u32 key_[8], const octet key[], size_t len)
{
	ASSERT(memIsValid(key_, 32));
	ASSERT(len == 16 || len == 24 || len == 32);
	ASSERT(memIsValid(key, len));
	u32From(key_, key, len);
	if (len == 16)
	{
		key_[4] = key_[0];
		key_[5] = key_[1];
		key_[6] = key_[2];
		key_[7] = key_[3];
	}
	else if (len == 24)
	{
		key_[6] = key_[0] ^ key_[1] ^ key_[2];
		key_[7] = key_[3] ^ key_[4] ^ key_[5];
	}
}